

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database_tmpl_impl.hpp
# Opt level: O0

vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_> * __thiscall
hiberlite::Database::getAllBeans<Person>
          (vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>
           *__return_storage_ptr__,Database *this)

{
  reference pvVar1;
  bean_ptr<Person> local_70;
  size_type local_58;
  size_t i;
  undefined1 local_39;
  size_type local_38;
  size_t N;
  vector<long_long,_std::allocator<long_long>_> ids;
  Database *this_local;
  vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_> *ans;
  
  ids.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  getBeanIds<Person>((vector<long_long,_std::allocator<long_long>_> *)&N,this);
  local_38 = std::vector<long_long,_std::allocator<long_long>_>::size
                       ((vector<long_long,_std::allocator<long_long>_> *)&N);
  local_39 = 0;
  std::vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>::vector
            (__return_storage_ptr__);
  std::vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>::reserve
            (__return_storage_ptr__,local_38);
  for (local_58 = 0; local_58 < local_38; local_58 = local_58 + 1) {
    pvVar1 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                       ((vector<long_long,_std::allocator<long_long>_> *)&N,local_58);
    loadBean<Person>(&local_70,this,*pvVar1);
    std::vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>::
    push_back(__return_storage_ptr__,&local_70);
    bean_ptr<Person>::~bean_ptr(&local_70);
  }
  local_39 = 1;
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)&N);
  return __return_storage_ptr__;
}

Assistant:

std::vector< bean_ptr<C> > Database::getAllBeans()
{
	std::vector<sqlid_t> ids=getBeanIds<C>();
	size_t N=ids.size();
	std::vector< bean_ptr<C> > ans;
	ans.reserve(N);
	for(size_t i=0;i<N;i++)
		ans.push_back( loadBean<C>(ids[i]) );
	return ans;
}